

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_makemapnode(uint32_t var,MTBDD low,MTBDD high)

{
  long *plVar1;
  MTBDD MVar2;
  ulong b;
  long in_FS_OFFSET;
  int created;
  int local_6c;
  Task local_68;
  
  if ((long)low < 0) {
    __assert_fail("!MTBDD_HASMARK(low)",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                  ,0x1f5,"MTBDD mtbdd_makemapnode(uint32_t, MTBDD, MTBDD)");
  }
  b = (ulong)var << 0x28 | low;
  MVar2 = llmsset_lookup(nodes,high | 0x1000000000000000,b,&local_6c);
  if (MVar2 == 0) {
    mtbdd_refs_push(low);
    mtbdd_refs_push(high);
    local_68.f = sylvan_gc_WRAP;
    local_68.thief = (_Worker *)0x1;
    lace_run_task(&local_68);
    plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
    *plVar1 = *plVar1 + -0x10;
    MVar2 = llmsset_lookup(nodes,high | 0x1000000000000000,b,&local_6c);
    if (MVar2 == 0) {
      mtbdd_makemapnode_cold_1();
    }
  }
  return MVar2;
}

Assistant:

MTBDD
mtbdd_makemapnode(uint32_t var, MTBDD low, MTBDD high)
{
    struct mtbddnode n;
    uint64_t index;
    int created;

    // in an MTBDDMAP, the low edges eventually lead to 0 and cannot have a low mark
    assert(!MTBDD_HASMARK(low));

    mtbddnode_makemapnode(&n, var, low, high);
    index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        mtbdd_refs_push(low);
        mtbdd_refs_push(high);
        RUN(sylvan_gc);
        mtbdd_refs_pop(2);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return index;
}